

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O2

time_t lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)

{
  uchar *__s;
  size_t sVar1;
  time_t tVar2;
  long lStack_50;
  tm local_40;
  
  __s = as->data;
  local_40.tm_gmtoff = 0;
  local_40.tm_zone = (char *)0x0;
  local_40.tm_wday = 0;
  local_40.tm_yday = 0;
  local_40.tm_isdst = 0;
  local_40._36_4_ = 0;
  sVar1 = strlen((char *)__s);
  if (sVar1 == 0xd) {
    local_40.tm_year = (int)(char)__s[1] + (char)*__s * 10 + -0x1ac;
    lStack_50 = 2;
  }
  else {
    local_40.tm_year =
         (int)(char)__s[3] + (char)__s[2] * 10 + (char)__s[1] * 100 + (char)*__s * 1000 + -0xd050;
    lStack_50 = 4;
  }
  local_40.tm_mon = (char)__s[lStack_50 + 1] + -0x211 + (char)__s[lStack_50] * 10;
  local_40.tm_mday = (char)__s[lStack_50 + 3] + -0x211 + (char)__s[lStack_50 + 2] * 10;
  local_40.tm_hour = (char)__s[lStack_50 + 5] + -0x210 + (char)__s[lStack_50 + 4] * 10;
  local_40.tm_min = (char)__s[lStack_50 + 7] + -0x210 + (char)__s[lStack_50 + 6] * 10;
  local_40.tm_sec = (char)__s[lStack_50 + 9] + -0x210 + (char)__s[lStack_50 + 8] * 10;
  tVar2 = mktime(&local_40);
  return tVar2;
}

Assistant:

static time_t
lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)
{
#if !defined(LWS_PLAT_OPTEE)

	const char *p = (const char *)as->data;
	struct tm t;

	/* [YY]YYMMDDHHMMSSZ */

	memset(&t, 0, sizeof(t));

	if (strlen(p) == 13) {
		t.tm_year = (dec(p[0]) * 10) + dec(p[1]) + 100;
		p += 2;
	} else {
		t.tm_year = (dec(p[0]) * 1000) + (dec(p[1]) * 100) +
			    (dec(p[2]) * 10) + dec(p[3]);
		p += 4;
	}
	t.tm_mon = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_mday = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_hour = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_min = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_sec = (dec(p[0]) * 10) + dec(p[1]);
	t.tm_isdst = 0;

	return mktime(&t);
#else
	return (time_t)-1;
#endif
}